

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_variableEquivalencePublicInterface_Test::TestBody
          (Variable_variableEquivalencePublicInterface_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_250 [8];
  Message local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  Message local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1b0 [8];
  Message local_1a8 [15];
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [32];
  undefined1 local_138 [8];
  VariablePtr v2;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [8];
  VariablePtr v1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  ComponentPtr c2;
  ComponentPtr c1;
  ModelPtr model;
  Variable_variableEquivalencePublicInterface_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"model",&local_61);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"c1",&local_99);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"c2",
             (allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  libcellml::Variable::create();
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"v1",&local_f9);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"dimensionless",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create();
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"v2",&local_159);
  libcellml::NamedEntity::setName((string *)peVar5);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"dimensionless",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  libcellml::Component::addVariable((shared_ptr *)peVar4);
  libcellml::Variable::addEquivalence((shared_ptr *)local_d8,(shared_ptr *)local_138);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Model::fixVariableInterfaces();
  local_199 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_198,"model->fixVariableInterfaces()",
               "false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x607,pcVar6);
    testing::internal::AssertHelper::operator=(local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_d8);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_1e0,"\"public\"","v1->interfaceType()",(char (*) [7])"public",
             &local_200);
  std::__cxx11::string::~string((string *)&local_200);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar2) {
    testing::Message::Message(local_208);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x609,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_138);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_220,"\"public\"","v2->interfaceType()",(char (*) [7])"public",
             &local_240);
  std::__cxx11::string::~string((string *)&local_240);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(local_248);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x60a,pcVar6);
    testing::internal::AssertHelper::operator=(local_250,local_248);
    testing::internal::AssertHelper::~AssertHelper(local_250);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_138);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_40);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, variableEquivalencePublicInterface)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");

    model->addComponent(c1);
    model->addComponent(c2);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("v1");
    v1->setUnits("dimensionless");

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("v2");
    v2->setUnits("dimensionless");

    c1->addVariable(v1);
    c2->addVariable(v2);

    libcellml::Variable::addEquivalence(v1, v2);

    EXPECT_TRUE(model->fixVariableInterfaces());

    EXPECT_EQ("public", v1->interfaceType());
    EXPECT_EQ("public", v2->interfaceType());
}